

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quadbase.c
# Opt level: O0

void checkAfkDist(afk_meta_t *d,int x,int z)

{
  int x_00;
  int in_EDX;
  int in_ESI;
  undefined8 *in_RDI;
  int q;
  int in_stack_ffffffffffffffe8;
  
  if ((((-1 < in_ESI) && (-1 < in_EDX)) && (in_ESI < *(int *)(in_RDI + 4))) &&
     ((in_EDX < *(int *)((long)in_RDI + 0x24) &&
      (*(int *)(in_RDI[2] + (long)(in_EDX * *(int *)(in_RDI + 4) + in_ESI) * 4) == 0)))) {
    x_00 = blocksInRange((Pos *)*in_RDI,*(int *)(in_RDI + 1),in_ESI + *(int *)(in_RDI + 3),
                         in_EDX + *(int *)((long)in_RDI + 0x1c),*(int *)(in_RDI + 5),
                         *(int *)((long)in_RDI + 0x2c),(double)in_RDI[6]);
    *(int *)(in_RDI[2] + (long)(in_EDX * *(int *)(in_RDI + 4) + in_ESI) * 4) = x_00;
    if (*(int *)(in_RDI + 7) <= x_00) {
      if (*(int *)(in_RDI + 7) < x_00) {
        *(int *)(in_RDI + 7) = x_00;
        *(undefined4 *)((long)in_RDI + 0x3c) = 1;
        in_RDI[8] = (long)(*(int *)(in_RDI + 3) + in_ESI);
        in_RDI[9] = (long)(*(int *)((long)in_RDI + 0x1c) + in_EDX);
      }
      else {
        *(int *)((long)in_RDI + 0x3c) = *(int *)((long)in_RDI + 0x3c) + 1;
        in_RDI[8] = (long)(*(int *)(in_RDI + 3) + in_ESI) + in_RDI[8];
        in_RDI[9] = (long)(*(int *)((long)in_RDI + 0x1c) + in_EDX) + in_RDI[9];
      }
      checkAfkDist((afk_meta_t *)CONCAT44(in_ESI,in_EDX),x_00,in_stack_ffffffffffffffe8);
      checkAfkDist((afk_meta_t *)CONCAT44(in_ESI,in_EDX),x_00,in_stack_ffffffffffffffe8);
      checkAfkDist((afk_meta_t *)CONCAT44(in_ESI,in_EDX),x_00,in_stack_ffffffffffffffe8);
      checkAfkDist((afk_meta_t *)CONCAT44(in_ESI,in_EDX),x_00,in_stack_ffffffffffffffe8);
      checkAfkDist((afk_meta_t *)CONCAT44(in_ESI,in_EDX),x_00,in_stack_ffffffffffffffe8);
      checkAfkDist((afk_meta_t *)CONCAT44(in_ESI,in_EDX),x_00,in_stack_ffffffffffffffe8);
      checkAfkDist((afk_meta_t *)CONCAT44(in_ESI,in_EDX),x_00,in_stack_ffffffffffffffe8);
      checkAfkDist((afk_meta_t *)CONCAT44(in_ESI,in_EDX),x_00,in_stack_ffffffffffffffe8);
    }
  }
  return;
}

Assistant:

static void checkAfkDist(afk_meta_t *d, int x, int z)
{
    if (x < 0 || z < 0 || x >= d->w || z >= d->h)
        return;
    if (d->buf[z*d->w+x])
        return;

    int q = blocksInRange(d->p, d->n, x+d->x0, z+d->z0, d->ax, d->az, d->rsq);
    d->buf[z*d->w+x] = q;
    if (q >= d->best)
    {
        if (q > d->best)
        {
            d->best = q;
            d->sumn = 1;
            d->sumx = d->x0+x;
            d->sumz = d->z0+z;
        }
        else
        {
            d->sumn += 1;
            d->sumx += d->x0+x;
            d->sumz += d->z0+z;
        }
        checkAfkDist(d, x, z-1);
        checkAfkDist(d, x, z+1);
        checkAfkDist(d, x-1, z);
        checkAfkDist(d, x+1, z);
        checkAfkDist(d, x-1, z-1);
        checkAfkDist(d, x-1, z+1);
        checkAfkDist(d, x+1, z-1);
        checkAfkDist(d, x+1, z+1);
    }
}